

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O3

BVHNodeRecord<embree::NodeRefPtr<8>_> * __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>,_embree::avx::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BVHNodeRecord<embree::NodeRefPtr<8>_> *__return_storage_ptr__,
                 BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>,_embree::avx::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  ThreadLocal2 *this_00;
  iterator __position;
  undefined8 *puVar6;
  CachedAllocator alloc_00;
  FastAllocator *this_01;
  ThreadLocal *pTVar7;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>,_embree::avx::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
  *this_02;
  undefined1 (*pauVar8) [16];
  size_t sVar9;
  undefined8 *puVar10;
  ulong uVar11;
  range<unsigned_int> rVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  range<unsigned_int> rVar17;
  uint uVar18;
  ulong uVar19;
  range<unsigned_int> rVar20;
  ulong uVar21;
  ulong uVar22;
  range<unsigned_int> *current_00;
  ulong uVar23;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar24;
  undefined1 auVar25 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  range<unsigned_int> children [8];
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  undefined8 *local_248;
  ThreadLocal2 *local_240;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>,_embree::avx::CalculateMeshBounds<embree::InstanceArray>,_embree::Scene::BuildProgressMonitorInterface>
  *local_238;
  BVHNodeRecord<embree::NodeRefPtr<8>_> *local_230;
  BVHNodeRecord<embree::NodeRefPtr<8>_> local_228;
  range<unsigned_int> local_1f8 [8];
  undefined8 *local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined8 local_1a8 [2];
  undefined8 local_198 [45];
  
  this_01 = alloc.alloc;
  pTVar7 = alloc.talloc0;
  if ((this->super_Settings).maxDepth < depth) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"depth limit reached","");
    *puVar10 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar10 + 1) = 1;
    puVar10[2] = puVar10 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar10 + 2),local_1b8,(long)local_1b8 + CONCAT71(uStack_1af,local_1b0));
    __cxa_throw(puVar10,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar22 = (this->super_Settings).maxLeafSize;
  if (current->_end - current->_begin <= uVar22) {
    CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
    return __return_storage_ptr__;
  }
  local_1f8[0] = *current;
  uVar23 = (this->super_Settings).branchingFactor;
  uVar11 = 2;
  if (2 < uVar23) {
    uVar11 = uVar23;
  }
  uVar23 = 1;
  rVar12 = *current;
  do {
    uVar15 = 0;
    uVar19 = 0;
    uVar16 = 0xffffffffffffffff;
    do {
      uVar21 = (ulong)(local_1f8[uVar15]._end - local_1f8[uVar15]._begin);
      uVar14 = uVar15;
      if (uVar21 <= uVar22 || uVar21 <= uVar19) {
        uVar14 = uVar16;
        uVar21 = uVar19;
      }
      uVar19 = uVar21;
      uVar15 = uVar15 + 1;
      uVar16 = uVar14;
    } while (uVar23 != uVar15);
    uVar16 = uVar23;
    if (uVar14 == 0xffffffffffffffff) break;
    uVar18 = local_1f8[uVar14]._end + local_1f8[uVar14]._begin >> 1;
    rVar17._end = local_1f8[uVar14]._end;
    rVar17._begin = uVar18;
    rVar20._end = uVar18;
    rVar20._begin = local_1f8[uVar14]._begin;
    local_1f8[uVar14] = rVar12;
    local_1f8[uVar23 - 1] = rVar20;
    local_1f8[uVar23] = rVar17;
    uVar23 = uVar23 + 1;
    rVar12 = rVar17;
    uVar16 = uVar11;
  } while (uVar23 != uVar11);
  local_248 = (undefined8 *)0x100;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_228._8_1_ = '\x01';
    local_228.ref.ptr = (size_t)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar25 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_00->alloc0).end = auVar25._0_8_;
    (this_00->alloc0).allocBlockSize = auVar25._8_8_;
    (this_00->alloc0).bytesUsed = auVar25._16_8_;
    (this_00->alloc0).bytesWasted = auVar25._24_8_;
    (this_00->alloc0).ptr = (char *)auVar25._0_8_;
    (this_00->alloc0).cur = auVar25._8_8_;
    (this_00->alloc0).end = auVar25._16_8_;
    (this_00->alloc0).allocBlockSize = auVar25._24_8_;
    auVar25 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_01 == (FastAllocator *)0x0) {
      (this_00->alloc1).end = auVar25._0_8_;
      (this_00->alloc1).allocBlockSize = auVar25._8_8_;
      (this_00->alloc1).bytesUsed = auVar25._16_8_;
      (this_00->alloc1).bytesWasted = auVar25._24_8_;
      (this_00->alloc1).ptr = (char *)auVar25._0_8_;
      (this_00->alloc1).cur = auVar25._8_8_;
      (this_00->alloc1).end = auVar25._16_8_;
      (this_00->alloc1).allocBlockSize = auVar25._24_8_;
    }
    else {
      (this_00->alloc0).allocBlockSize = this_01->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)auVar25._0_8_;
      (this_00->alloc1).cur = auVar25._8_8_;
      (this_00->alloc1).end = auVar25._16_8_;
      (this_00->alloc1).allocBlockSize = auVar25._24_8_;
      (this_00->alloc1).end = auVar25._0_8_;
      (this_00->alloc1).allocBlockSize = auVar25._8_8_;
      (this_00->alloc1).bytesUsed = auVar25._16_8_;
      (this_00->alloc1).bytesWasted = auVar25._24_8_;
      (this_00->alloc1).allocBlockSize = this_01->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = this_01;
    UNLOCK();
    local_1b8 = &FastAllocator::s_thread_local_allocators_lock;
    local_1b0 = 1;
    local_240 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_01->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_01->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_01->thread_local_allocators,__position,&local_240);
    }
    else {
      *__position._M_current = local_240;
      pppTVar2 = &(this_01->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_228._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)local_228.ref.ptr);
    }
  }
  puVar10 = local_248;
  pTVar7->bytesUsed = pTVar7->bytesUsed + (long)local_248;
  sVar9 = pTVar7->cur;
  uVar22 = (ulong)(-(int)sVar9 & 0x1f);
  uVar23 = (long)local_248 + uVar22 + sVar9;
  pTVar7->cur = uVar23;
  local_238 = this;
  local_230 = __return_storage_ptr__;
  if (pTVar7->end < uVar23) {
    pTVar7->cur = sVar9;
    puVar6 = (undefined8 *)pTVar7->allocBlockSize;
    if ((undefined8 *)((long)local_248 * 4) < puVar6 || (long)local_248 * 4 - (long)puVar6 == 0) {
      local_1b8 = puVar6;
      pcVar13 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
      pTVar7->ptr = pcVar13;
      sVar9 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar9;
      pTVar7->end = (size_t)local_1b8;
      pTVar7->cur = (size_t)puVar10;
      if (local_1b8 < puVar10) {
        pTVar7->cur = 0;
        local_1b8 = (undefined8 *)pTVar7->allocBlockSize;
        pcVar13 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
        pTVar7->ptr = pcVar13;
        sVar9 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar9;
        pTVar7->end = (size_t)local_1b8;
        pTVar7->cur = (size_t)puVar10;
        if (local_1b8 < puVar10) {
          pTVar7->cur = 0;
          pcVar13 = (char *)0x0;
          goto LAB_0149e756;
        }
      }
      pTVar7->bytesWasted = sVar9;
    }
    else {
      pcVar13 = (char *)FastAllocator::malloc(this_01,(size_t)&local_248);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar22;
    pcVar13 = pTVar7->ptr + (uVar23 - (long)local_248);
  }
LAB_0149e756:
  this_02 = local_238;
  pcVar13[0xc0] = '\0';
  pcVar13[0xc1] = '\0';
  pcVar13[0xc2] = -0x80;
  pcVar13[0xc3] = '\x7f';
  pcVar13[0xc4] = '\0';
  pcVar13[0xc5] = '\0';
  pcVar13[0xc6] = -0x80;
  pcVar13[199] = '\x7f';
  pcVar13[200] = '\0';
  pcVar13[0xc9] = '\0';
  pcVar13[0xca] = -0x80;
  pcVar13[0xcb] = '\x7f';
  pcVar13[0xcc] = '\0';
  pcVar13[0xcd] = '\0';
  pcVar13[0xce] = -0x80;
  pcVar13[0xcf] = '\x7f';
  pcVar13[0xd0] = '\0';
  pcVar13[0xd1] = '\0';
  pcVar13[0xd2] = -0x80;
  pcVar13[0xd3] = '\x7f';
  pcVar13[0xd4] = '\0';
  pcVar13[0xd5] = '\0';
  pcVar13[0xd6] = -0x80;
  pcVar13[0xd7] = '\x7f';
  pcVar13[0xd8] = '\0';
  pcVar13[0xd9] = '\0';
  pcVar13[0xda] = -0x80;
  pcVar13[0xdb] = '\x7f';
  pcVar13[0xdc] = '\0';
  pcVar13[0xdd] = '\0';
  pcVar13[0xde] = -0x80;
  pcVar13[0xdf] = '\x7f';
  pcVar13[0x80] = '\0';
  pcVar13[0x81] = '\0';
  pcVar13[0x82] = -0x80;
  pcVar13[0x83] = '\x7f';
  pcVar13[0x84] = '\0';
  pcVar13[0x85] = '\0';
  pcVar13[0x86] = -0x80;
  pcVar13[0x87] = '\x7f';
  pcVar13[0x88] = '\0';
  pcVar13[0x89] = '\0';
  pcVar13[0x8a] = -0x80;
  pcVar13[0x8b] = '\x7f';
  pcVar13[0x8c] = '\0';
  pcVar13[0x8d] = '\0';
  pcVar13[0x8e] = -0x80;
  pcVar13[0x8f] = '\x7f';
  pcVar13[0x90] = '\0';
  pcVar13[0x91] = '\0';
  pcVar13[0x92] = -0x80;
  pcVar13[0x93] = '\x7f';
  pcVar13[0x94] = '\0';
  pcVar13[0x95] = '\0';
  pcVar13[0x96] = -0x80;
  pcVar13[0x97] = '\x7f';
  pcVar13[0x98] = '\0';
  pcVar13[0x99] = '\0';
  pcVar13[0x9a] = -0x80;
  pcVar13[0x9b] = '\x7f';
  pcVar13[0x9c] = '\0';
  pcVar13[0x9d] = '\0';
  pcVar13[0x9e] = -0x80;
  pcVar13[0x9f] = '\x7f';
  pcVar13[0x40] = '\0';
  pcVar13[0x41] = '\0';
  pcVar13[0x42] = -0x80;
  pcVar13[0x43] = '\x7f';
  pcVar13[0x44] = '\0';
  pcVar13[0x45] = '\0';
  pcVar13[0x46] = -0x80;
  pcVar13[0x47] = '\x7f';
  pcVar13[0x48] = '\0';
  pcVar13[0x49] = '\0';
  pcVar13[0x4a] = -0x80;
  pcVar13[0x4b] = '\x7f';
  pcVar13[0x4c] = '\0';
  pcVar13[0x4d] = '\0';
  pcVar13[0x4e] = -0x80;
  pcVar13[0x4f] = '\x7f';
  pcVar13[0x50] = '\0';
  pcVar13[0x51] = '\0';
  pcVar13[0x52] = -0x80;
  pcVar13[0x53] = '\x7f';
  pcVar13[0x54] = '\0';
  pcVar13[0x55] = '\0';
  pcVar13[0x56] = -0x80;
  pcVar13[0x57] = '\x7f';
  pcVar13[0x58] = '\0';
  pcVar13[0x59] = '\0';
  pcVar13[0x5a] = -0x80;
  pcVar13[0x5b] = '\x7f';
  pcVar13[0x5c] = '\0';
  pcVar13[0x5d] = '\0';
  pcVar13[0x5e] = -0x80;
  pcVar13[0x5f] = '\x7f';
  pcVar13[0xe0] = '\0';
  pcVar13[0xe1] = '\0';
  pcVar13[0xe2] = -0x80;
  pcVar13[0xe3] = -1;
  pcVar13[0xe4] = '\0';
  pcVar13[0xe5] = '\0';
  pcVar13[0xe6] = -0x80;
  pcVar13[0xe7] = -1;
  pcVar13[0xe8] = '\0';
  pcVar13[0xe9] = '\0';
  pcVar13[0xea] = -0x80;
  pcVar13[0xeb] = -1;
  pcVar13[0xec] = '\0';
  pcVar13[0xed] = '\0';
  pcVar13[0xee] = -0x80;
  pcVar13[0xef] = -1;
  pcVar13[0xf0] = '\0';
  pcVar13[0xf1] = '\0';
  pcVar13[0xf2] = -0x80;
  pcVar13[0xf3] = -1;
  pcVar13[0xf4] = '\0';
  pcVar13[0xf5] = '\0';
  pcVar13[0xf6] = -0x80;
  pcVar13[0xf7] = -1;
  pcVar13[0xf8] = '\0';
  pcVar13[0xf9] = '\0';
  pcVar13[0xfa] = -0x80;
  pcVar13[0xfb] = -1;
  pcVar13[0xfc] = '\0';
  pcVar13[0xfd] = '\0';
  pcVar13[0xfe] = -0x80;
  pcVar13[0xff] = -1;
  pcVar13[0xa0] = '\0';
  pcVar13[0xa1] = '\0';
  pcVar13[0xa2] = -0x80;
  pcVar13[0xa3] = -1;
  pcVar13[0xa4] = '\0';
  pcVar13[0xa5] = '\0';
  pcVar13[0xa6] = -0x80;
  pcVar13[0xa7] = -1;
  pcVar13[0xa8] = '\0';
  pcVar13[0xa9] = '\0';
  pcVar13[0xaa] = -0x80;
  pcVar13[0xab] = -1;
  pcVar13[0xac] = '\0';
  pcVar13[0xad] = '\0';
  pcVar13[0xae] = -0x80;
  pcVar13[0xaf] = -1;
  pcVar13[0xb0] = '\0';
  pcVar13[0xb1] = '\0';
  pcVar13[0xb2] = -0x80;
  pcVar13[0xb3] = -1;
  pcVar13[0xb4] = '\0';
  pcVar13[0xb5] = '\0';
  pcVar13[0xb6] = -0x80;
  pcVar13[0xb7] = -1;
  pcVar13[0xb8] = '\0';
  pcVar13[0xb9] = '\0';
  pcVar13[0xba] = -0x80;
  pcVar13[0xbb] = -1;
  pcVar13[0xbc] = '\0';
  pcVar13[0xbd] = '\0';
  pcVar13[0xbe] = -0x80;
  pcVar13[0xbf] = -1;
  pcVar13[0x60] = '\0';
  pcVar13[0x61] = '\0';
  pcVar13[0x62] = -0x80;
  pcVar13[99] = -1;
  pcVar13[100] = '\0';
  pcVar13[0x65] = '\0';
  pcVar13[0x66] = -0x80;
  pcVar13[0x67] = -1;
  pcVar13[0x68] = '\0';
  pcVar13[0x69] = '\0';
  pcVar13[0x6a] = -0x80;
  pcVar13[0x6b] = -1;
  pcVar13[0x6c] = '\0';
  pcVar13[0x6d] = '\0';
  pcVar13[0x6e] = -0x80;
  pcVar13[0x6f] = -1;
  pcVar13[0x70] = '\0';
  pcVar13[0x71] = '\0';
  pcVar13[0x72] = -0x80;
  pcVar13[0x73] = -1;
  pcVar13[0x74] = '\0';
  pcVar13[0x75] = '\0';
  pcVar13[0x76] = -0x80;
  pcVar13[0x77] = -1;
  pcVar13[0x78] = '\0';
  pcVar13[0x79] = '\0';
  pcVar13[0x7a] = -0x80;
  pcVar13[0x7b] = -1;
  pcVar13[0x7c] = '\0';
  pcVar13[0x7d] = '\0';
  pcVar13[0x7e] = -0x80;
  pcVar13[0x7f] = -1;
  pcVar13[0] = '\b';
  pcVar13[1] = '\0';
  pcVar13[2] = '\0';
  pcVar13[3] = '\0';
  pcVar13[4] = '\0';
  pcVar13[5] = '\0';
  pcVar13[6] = '\0';
  pcVar13[7] = '\0';
  pcVar13[8] = '\b';
  pcVar13[9] = '\0';
  pcVar13[10] = '\0';
  pcVar13[0xb] = '\0';
  pcVar13[0xc] = '\0';
  pcVar13[0xd] = '\0';
  pcVar13[0xe] = '\0';
  pcVar13[0xf] = '\0';
  pcVar13[0x10] = '\b';
  pcVar13[0x11] = '\0';
  pcVar13[0x12] = '\0';
  pcVar13[0x13] = '\0';
  pcVar13[0x14] = '\0';
  pcVar13[0x15] = '\0';
  pcVar13[0x16] = '\0';
  pcVar13[0x17] = '\0';
  pcVar13[0x18] = '\b';
  pcVar13[0x19] = '\0';
  pcVar13[0x1a] = '\0';
  pcVar13[0x1b] = '\0';
  pcVar13[0x1c] = '\0';
  pcVar13[0x1d] = '\0';
  pcVar13[0x1e] = '\0';
  pcVar13[0x1f] = '\0';
  pcVar13[0x20] = '\b';
  pcVar13[0x21] = '\0';
  pcVar13[0x22] = '\0';
  pcVar13[0x23] = '\0';
  pcVar13[0x24] = '\0';
  pcVar13[0x25] = '\0';
  pcVar13[0x26] = '\0';
  pcVar13[0x27] = '\0';
  pcVar13[0x28] = '\b';
  pcVar13[0x29] = '\0';
  pcVar13[0x2a] = '\0';
  pcVar13[0x2b] = '\0';
  pcVar13[0x2c] = '\0';
  pcVar13[0x2d] = '\0';
  pcVar13[0x2e] = '\0';
  pcVar13[0x2f] = '\0';
  pcVar13[0x30] = '\b';
  pcVar13[0x31] = '\0';
  pcVar13[0x32] = '\0';
  pcVar13[0x33] = '\0';
  pcVar13[0x34] = '\0';
  pcVar13[0x35] = '\0';
  pcVar13[0x36] = '\0';
  pcVar13[0x37] = '\0';
  pcVar13[0x38] = '\b';
  pcVar13[0x39] = '\0';
  pcVar13[0x3a] = '\0';
  pcVar13[0x3b] = '\0';
  pcVar13[0x3c] = '\0';
  pcVar13[0x3d] = '\0';
  pcVar13[0x3e] = '\0';
  pcVar13[0x3f] = '\0';
  current_00 = local_1f8;
  puVar10 = local_198;
  uVar22 = uVar16;
  do {
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(&local_228,this_02,depth + 1,current_00,alloc_00);
    puVar10[-4] = local_228.ref.ptr;
    puVar10[-2] = local_228.bounds.lower.field_0._0_8_;
    puVar10[-1] = local_228.bounds.lower.field_0._8_8_;
    *puVar10 = local_228.bounds.upper.field_0._0_8_;
    puVar10[1] = local_228.bounds.upper.field_0._8_8_;
    puVar10 = puVar10 + 6;
    current_00 = current_00 + 1;
    uVar22 = uVar22 - 1;
  } while (uVar22 != 0);
  aVar26.m128[2] = INFINITY;
  aVar26._0_8_ = 0x7f8000007f800000;
  aVar26.m128[3] = INFINITY;
  aVar24.m128[2] = -INFINITY;
  aVar24._0_8_ = 0xff800000ff800000;
  aVar24.m128[3] = -INFINITY;
  pauVar8 = (undefined1 (*) [16])local_198;
  uVar22 = 0;
  do {
    auVar3 = pauVar8[-1];
    auVar4 = *pauVar8;
    *(undefined8 *)(pcVar13 + uVar22 * 8) = *(undefined8 *)pauVar8[-2];
    *(int *)(pcVar13 + uVar22 * 4 + 0x40) = auVar3._0_4_;
    uVar5 = vextractps_avx(auVar3,1);
    *(undefined4 *)(pcVar13 + uVar22 * 4 + 0x80) = uVar5;
    uVar5 = vextractps_avx(auVar3,2);
    *(undefined4 *)(pcVar13 + uVar22 * 4 + 0xc0) = uVar5;
    *(int *)(pcVar13 + uVar22 * 4 + 0x60) = auVar4._0_4_;
    uVar5 = vextractps_avx(auVar4,1);
    *(undefined4 *)(pcVar13 + uVar22 * 4 + 0xa0) = uVar5;
    aVar26.m128 = (__m128)vminps_avx(aVar26.m128,auVar3);
    uVar5 = vextractps_avx(auVar4,2);
    *(undefined4 *)(pcVar13 + uVar22 * 4 + 0xe0) = uVar5;
    aVar24.m128 = (__m128)vmaxps_avx(aVar24.m128,auVar4);
    uVar22 = uVar22 + 1;
    pauVar8 = pauVar8 + 3;
  } while (uVar16 != uVar22);
  (local_230->ref).ptr = (size_t)pcVar13;
  (local_230->bounds).lower.field_0 = aVar26;
  (local_230->bounds).upper.field_0 = aVar24;
  return local_230;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }